

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O1

void __thiscall AnalyserUnits_multipliers_Test::TestBody(AnalyserUnits_multipliers_Test *this)

{
  char cVar1;
  long *plVar2;
  char *pcVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_633;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  ModelPtr model;
  ParserPtr parser;
  AnalyserPtr analyser;
  ScopedTrace local_e9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  undefined1 local_d8 [32];
  string local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  undefined1 local_a8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  long *local_38 [2];
  long local_28 [2];
  
  libcellml::Parser::create(SUB81(local_a8,0));
  local_d8._0_8_ = (pointer)(local_d8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"analyser/units/multipliers.cellml","");
  fileContents((string *)&local_98);
  libcellml::Parser::parseModel(local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_d8._16_8_)->_M_p + 1));
  }
  local_d8._0_8_ = (pointer)0x0;
  local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,"size_t(0)","parser->issueCount()",(unsigned_long *)local_d8,
             (unsigned_long *)&local_e8);
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_d8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)(undefined1 *)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
               ,0x26c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((pointer)local_d8._0_8_ != (pointer)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((pointer)local_d8._0_8_ != (pointer)0x0)) {
        (**(code **)(((_Alloc_hider *)local_d8._0_8_)->_M_p + 8))();
      }
      local_d8._0_8_ = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "The units in \'a = 1.0\' in component \'main\' are not equivalent. \'a\' is in \'second\' while \'1.0\' is in \'millisecond\' (i.e. \'10^-3 x second\')."
             ,"");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "The units in \'b = 3.0\' in component \'main\' are not equivalent. \'b\' is in \'volt\' (i.e. \'ampere^-1 x kilogram x metre^2 x second^-3\') while \'3.0\' is in \'millivolt\' (i.e. \'10^-3 x ampere^-1 x kilogram x metre^2 x second^-3\')."
             ,"");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "The units in \'c = 5.0\' in component \'main\' are not equivalent. \'c\' is in \'frog\' while \'5.0\' is in \'millifrog\' (i.e. \'10^-3 x frog\')."
             ,"");
  plVar2 = local_28;
  local_38[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,
             "The units in \'d = 7.0\' in component \'main\' are not equivalent. \'d\' is in \'imaginary\' (i.e. \'10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16\') while \'7.0\' is in \'milliimaginary\' (i.e. \'10^-48 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16\')."
             ,"");
  __l._M_len = 4;
  __l._M_array = &local_98;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d8,__l,(allocator_type *)&local_e8);
  lVar4 = -0x80;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel((shared_ptr *)local_98._M_dataplus._M_p);
  testing::ScopedTrace::ScopedTrace
            (&local_e9,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
             ,0x279,"Issue occurred here.");
  local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_98._M_dataplus._M_p;
  local_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_98._M_string_length + 8) = *(int *)(local_98._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_98._M_string_length + 8) = *(int *)(local_98._M_string_length + 8) + 1;
    }
  }
  expectEqualIssues((vector *)local_d8,(shared_ptr *)&local_e8);
  if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
  }
  testing::ScopedTrace::~ScopedTrace(&local_e9);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  return;
}

Assistant:

TEST(AnalyserUnits, multipliers)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("analyser/units/multipliers.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "The units in 'a = 1.0' in component 'main' are not equivalent. 'a' is in 'second' while '1.0' is in 'millisecond' (i.e. '10^-3 x second').",
        "The units in 'b = 3.0' in component 'main' are not equivalent. 'b' is in 'volt' (i.e. 'ampere^-1 x kilogram x metre^2 x second^-3') while '3.0' is in 'millivolt' (i.e. '10^-3 x ampere^-1 x kilogram x metre^2 x second^-3').",
        "The units in 'c = 5.0' in component 'main' are not equivalent. 'c' is in 'frog' while '5.0' is in 'millifrog' (i.e. '10^-3 x frog').",
        "The units in 'd = 7.0' in component 'main' are not equivalent. 'd' is in 'imaginary' (i.e. '10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16') while '7.0' is in 'milliimaginary' (i.e. '10^-48 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16').",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES(expectedIssues, analyser);
}